

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void update_txfm_count(MACROBLOCK *x,MACROBLOCKD *xd,FRAME_COUNTS *counts,TX_SIZE tx_size,int depth,
                      int blk_row,int blk_col,uint8_t allow_update_cdf)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 in_CL;
  MACROBLOCKD *in_RDX;
  MACROBLOCK *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  uint8_t uStack0000000000000008;
  char in_stack_00000010;
  int offsetc;
  int offsetr;
  int col;
  int row;
  int bsh;
  int bsw;
  TX_SIZE sub_txs;
  TX_SIZE plane_tx_size;
  int txb_size_index;
  int ctx;
  int max_blocks_wide;
  int max_blocks_high;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  TX_SIZE in_stack_ffffffffffffff9e;
  BLOCK_SIZE in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  BLOCK_SIZE *pBVar6;
  int in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 uVar7;
  BLOCK_SIZE BVar8;
  
  uVar7 = CONCAT13(in_CL,in_stack_ffffffffffffffe4);
  pBVar6 = *(BLOCK_SIZE **)(in_RSI->e_mbd).plane[2].seg_qmatrix[5][8];
  BVar8 = *pBVar6;
  iVar2 = max_block_high((MACROBLOCKD *)in_RSI,BVar8,0);
  iVar3 = max_block_wide((MACROBLOCKD *)in_RSI,BVar8,0);
  iVar4 = txfm_partition_context
                    ((TXFM_CONTEXT *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (TXFM_CONTEXT *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9f,in_stack_ffffffffffffff9e);
  iVar5 = av1_get_txb_size_index(BVar8,in_R9D,_uStack0000000000000008);
  if ((in_R9D < iVar2) && (_uStack0000000000000008 < iVar3)) {
    BVar8 = (BLOCK_SIZE)((uint)uVar7 >> 0x18);
    if (in_R8D == 2) {
      pBVar6[0x91] = BVar8;
      txfm_partition_update
                ((in_RSI->e_mbd).plane[2].seg_qmatrix[7][3] + _uStack0000000000000008,
                 (in_RSI->e_mbd).plane[2].seg_qmatrix[7][4] + in_R9D,BVar8,BVar8);
    }
    else if (BVar8 == pBVar6[(long)iVar5 + 0x92]) {
      if (in_stack_00000010 != '\0') {
        update_cdf((aom_cdf_prob *)(*(long *)(in_RSI->e_mbd).weight[4] + 0x2d86 + (long)iVar4 * 6),
                   '\0',2);
      }
      BVar8 = (BLOCK_SIZE)((uint)uVar7 >> 0x18);
      pBVar6[0x91] = BVar8;
      txfm_partition_update
                ((in_RSI->e_mbd).plane[2].seg_qmatrix[7][3] + _uStack0000000000000008,
                 (in_RSI->e_mbd).plane[2].seg_qmatrix[7][4] + in_R9D,BVar8,BVar8);
    }
    else {
      bVar1 = ""[BVar8];
      iVar2 = tx_size_wide_unit[bVar1];
      iVar3 = tx_size_high_unit[bVar1];
      if (in_stack_00000010 != '\0') {
        update_cdf((aom_cdf_prob *)(*(long *)(in_RSI->e_mbd).weight[4] + 0x2d86 + (long)iVar4 * 6),
                   '\x01',2);
      }
      *(int *)(in_RDI + 0x25618) = *(int *)(in_RDI + 0x25618) + 1;
      if (bVar1 == 0) {
        pBVar6[(long)iVar5 + 0x92] = BLOCK_4X4;
        pBVar6[0x91] = BLOCK_4X4;
        txfm_partition_update
                  ((in_RSI->e_mbd).plane[2].seg_qmatrix[7][3] + _uStack0000000000000008,
                   (in_RSI->e_mbd).plane[2].seg_qmatrix[7][4] + in_R9D,'\0',
                   (TX_SIZE)((uint)uVar7 >> 0x18));
      }
      else {
        for (iVar4 = 0; iVar4 < tx_size_high_unit[(byte)((uint)uVar7 >> 0x18)];
            iVar4 = iVar3 + iVar4) {
          for (iVar5 = 0; iVar5 < tx_size_wide_unit[(byte)((uint)uVar7 >> 0x18)];
              iVar5 = iVar2 + iVar5) {
            update_txfm_count(in_RSI,in_RDX,(FRAME_COUNTS *)CONCAT44(uVar7,in_R8D),
                              (TX_SIZE)((uint)in_R9D >> 0x18),in_stack_ffffffffffffffd8,
                              (int)((ulong)pBVar6 >> 0x20),unaff_retaddr,uStack0000000000000008);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void update_txfm_count(MACROBLOCK *x, MACROBLOCKD *xd,
                              FRAME_COUNTS *counts, TX_SIZE tx_size, int depth,
                              int blk_row, int blk_col,
                              uint8_t allow_update_cdf) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                   xd->left_txfm_context + blk_row, mbmi->bsize,
                                   tx_size);
  const int txb_size_index = av1_get_txb_size_index(bsize, blk_row, blk_col);
  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[txb_size_index];

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;
  assert(tx_size > TX_4X4);

  if (depth == MAX_VARTX_DEPTH) {
    // Don't add to counts in this case
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  if (tx_size == plane_tx_size) {
#if CONFIG_ENTROPY_STATS
    ++counts->txfm_partition[ctx][0];
#endif
    if (allow_update_cdf)
      update_cdf(xd->tile_ctx->txfm_partition_cdf[ctx], 0, 2);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

#if CONFIG_ENTROPY_STATS
    ++counts->txfm_partition[ctx][1];
#endif
    if (allow_update_cdf)
      update_cdf(xd->tile_ctx->txfm_partition_cdf[ctx], 1, 2);
    ++x->txfm_search_info.txb_split_count;

    if (sub_txs == TX_4X4) {
      mbmi->inter_tx_size[txb_size_index] = TX_4X4;
      mbmi->tx_size = TX_4X4;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, TX_4X4, tx_size);
      return;
    }

    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        int offsetr = row;
        int offsetc = col;

        update_txfm_count(x, xd, counts, sub_txs, depth + 1, blk_row + offsetr,
                          blk_col + offsetc, allow_update_cdf);
      }
    }
  }
}